

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O1

xmlCharEncError UTF8ToUTF16BE(void *vctxt,uchar *out,int *outlen,uchar *in,int *inlen,int flush)

{
  xmlCharEncError xVar1;
  byte bVar3;
  uint uVar2;
  int iVar4;
  int iVar5;
  byte *pbVar6;
  byte *pbVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  long lVar14;
  
  iVar5 = (int)in;
  xVar1 = XML_ENC_ERR_INTERNAL;
  if (inlen != (int *)0x0 && (outlen != (int *)0x0 && out != (uchar *)0x0)) {
    if (in == (uchar *)0x0) {
      *outlen = 0;
      iVar5 = 0;
      xVar1 = XML_ENC_ERR_SUCCESS;
    }
    else {
      iVar10 = (int)out;
      if (0 < (long)*inlen) {
        pbVar7 = in + *inlen;
        pbVar6 = out + ((long)*outlen & 0xfffffffffffffffe);
        xVar1 = XML_ENC_ERR_SPACE;
        do {
          bVar3 = *in;
          if ((char)bVar3 < '\0') {
            if (bVar3 < 0xe0) {
              if (0xc1 < bVar3) {
                uVar12 = bVar3 & 0x1f;
                uVar11 = 0x80;
                lVar14 = 2;
                goto LAB_0012acbf;
              }
LAB_0012ad2b:
              iVar4 = 4;
              xVar1 = XML_ENC_ERR_INPUT;
            }
            else {
              lVar14 = 4 - (ulong)(bVar3 < 0xf0);
              uVar11 = 0x10000;
              if (bVar3 < 0xf0) {
                uVar11 = 0x800;
              }
              uVar12 = bVar3 & 0xf;
LAB_0012acbf:
              iVar4 = 3;
              if ((long)pbVar7 - (long)in < lVar14) goto LAB_0012ad30;
              lVar8 = 1;
              do {
                uVar13 = uVar12;
                iVar4 = 4;
                if ((in[lVar8] & 0xc0) != 0x80) goto LAB_0012ad2b;
                uVar2 = uVar13 << 6;
                uVar12 = in[lVar8] & 0x3f | uVar2;
                lVar8 = lVar8 + 1;
              } while (lVar14 != lVar8);
              if ((uVar12 < uVar11) || (0x10ffff < uVar2 || (uVar13 & 0x3ffffe0) == 0x360))
              goto LAB_0012ad2b;
              bVar3 = (byte)(uVar2 >> 8);
              if (uVar2 < 0x10000) {
                if (out < pbVar6) {
                  *out = bVar3;
                  lVar8 = 2;
                  lVar9 = 1;
LAB_0012ada4:
                  out[lVar9] = (byte)uVar12;
                  out = out + lVar8;
                  in = in + lVar14;
                  iVar4 = 0;
                }
              }
              else if (3 < (long)pbVar6 - (long)out) {
                *out = (byte)(uVar12 - 0x10000 >> 0x12) | 0xd8;
                out[1] = (byte)(uVar12 - 0x10000 >> 10);
                out[2] = bVar3 & 3 | 0xdc;
                lVar8 = 4;
                lVar9 = 3;
                goto LAB_0012ada4;
              }
            }
LAB_0012ad30:
            if (iVar4 != 0) {
              if (iVar4 != 3) {
                if (iVar4 != 4) {
                  return xVar1;
                }
                goto LAB_0012add2;
              }
              break;
            }
          }
          else {
            if (pbVar6 <= out) goto LAB_0012add2;
            *out = 0;
            out[1] = bVar3;
            in = in + 1;
            out = out + 2;
          }
        } while (in < pbVar7);
      }
      xVar1 = (int)out - iVar10;
LAB_0012add2:
      *outlen = (int)out - iVar10;
      iVar5 = (int)in - iVar5;
    }
    *inlen = iVar5;
  }
  return xVar1;
}

Assistant:

static xmlCharEncError
UTF8ToUTF16BE(void *vctxt ATTRIBUTE_UNUSED,
              unsigned char *out, int *outlen,
              const unsigned char *in, int *inlen,
              int flush ATTRIBUTE_UNUSED) {
    const unsigned char *instart = in;
    const unsigned char *inend;
    unsigned char *outstart = out;
    unsigned char *outend;
    unsigned c, d;
    int ret = XML_ENC_ERR_SPACE;

    /* UTF-16BE has no BOM */
    if ((out == NULL) || (outlen == NULL) || (inlen == NULL)) return(-1);
    if (in == NULL) {
	*outlen = 0;
	*inlen = 0;
	return(0);
    }
    inend = in + *inlen;
    outend = out + (*outlen & ~1);
    while (in < inend) {
        c = in[0];

        if (c < 0x80) {
            if (out >= outend)
                goto done;
            out[0] = 0;
            out[1] = c;
            in += 1;
            out += 2;
        } else {
            int i, len;
            unsigned min;

            if (c < 0xE0) {
                if (c < 0xC2) {
                    ret = XML_ENC_ERR_INPUT;
                    goto done;
                }
                c &= 0x1F;
                len = 2;
                min = 0x80;
            } else if (c < 0xF0) {
                c &= 0x0F;
                len = 3;
                min = 0x800;
            } else {
                c &= 0x0F;
                len = 4;
                min = 0x10000;
            }

            if (inend - in < len)
                break;

            for (i = 1; i < len; i++) {
                if ((in[i] & 0xC0) != 0x80) {
                    ret = XML_ENC_ERR_INPUT;
                    goto done;
                }
                c = (c << 6) | (in[i] & 0x3F);
            }

            if ((c < min) ||
                ((c >= 0xD800) && (c <= 0xDFFF)) ||
                (c > 0x10FFFF)) {
                ret = XML_ENC_ERR_INPUT;
                goto done;
            }

            if (c < 0x10000) {
                if (out >= outend)
                    goto done;
                out[0] = c >> 8;
                out[1] = c & 0xFF;
                out += 2;
            } else {
                if (outend - out < 4)
                    goto done;
                c -= 0x10000;
                d = (c & 0x03FF) | 0xDC00;
                c = (c >> 10)    | 0xD800;
                out[0] = c >> 8;
                out[1] = c & 0xFF;
                out[2] = d >> 8;
                out[3] = d & 0xFF;
                out += 4;
            }

            in += len;
        }
    }

    ret = out - outstart;

done:
    *outlen = out - outstart;
    *inlen = in - instart;
    return(ret);
}